

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O0

size_t NoSmallerEigenvals(size_t n,double *Alpha,double *Beta,double Lambda)

{
  double dVar1;
  ulong local_58;
  size_t i;
  double Sign;
  double pOld;
  double pNew;
  double p;
  size_t No;
  double Lambda_local;
  double *Beta_local;
  double *Alpha_local;
  size_t n_local;
  
  p = 0.0;
  Sign = 1.0;
  pNew = (Alpha[1] - Lambda) / ABS(Beta[1]);
  if ((ABS(pNew) < 2.2250738585072014e-307) || (pNew * 1.0 < 0.0)) {
    p = 4.94065645841247e-324;
  }
  for (local_58 = 2; local_58 <= n; local_58 = local_58 + 1) {
    dVar1 = ((Alpha[local_58] - Lambda) * pNew +
            -(Beta[local_58 - 1] * (Beta[local_58 - 1] / ABS(Beta[local_58 - 1])) * Sign)) /
            ABS(Beta[local_58]);
    Sign = pNew;
    if ((dVar1 * pNew < 0.0) ||
       ((ABS(dVar1) < 2.2250738585072014e-307 && (2.2250738585072014e-307 <= ABS(pNew))))) {
      p = (double)((long)p + 1);
    }
    pNew = dVar1;
  }
  return (size_t)p;
}

Assistant:

static size_t NoSmallerEigenvals(size_t n, double *Alpha, double *Beta, double Lambda)
/* returns number of eigenvalues of the tridiagonal matrix
   (Beta[i-1] Alpha[i] Beta[i]) (where 1 <= i <= n) 
   which are less then Lambda */
{
    size_t No;
    
    double p, pNew, pOld, Sign;
    size_t i;
    
    No = 0;
    
    pOld = 1.0;
    p = (Alpha[1] - Lambda) / fabs(Beta[1]);
    /* check for change of sign */
    if (IsZero(p) || p * pOld < 0)
        No++;
    
    for (i = 2; i <= n; i++) {
        Sign = Beta[i-1] / fabs(Beta[i-1]);
        pNew = ((Alpha[i] - Lambda) * p - Beta[i-1] * Sign * pOld) / fabs(Beta[i]);
        pOld = p;
        p = pNew;
	
	/* check for change of sign */
	if (p * pOld < 0 || (IsZero(p) && !IsZero(pOld)))
	    No++;
    }
   
    return(No);
}